

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O2

void __thiscall
crnlib::dxt_hc::create_alpha_selector_codebook_task(dxt_hc *this,uint64 data,void *pData_ptr)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  alpha_cluster *paVar4;
  color_quad_u8 (*pacVar5) [16];
  ulong uVar6;
  uint s_2;
  ulong uVar7;
  ulong uVar8;
  int *piVar9;
  ulong uVar10;
  int *piVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  uint s;
  ulong uVar16;
  long lVar17;
  long lVar18;
  uint s_1;
  int iVar19;
  ulong uVar20;
  uint best_error;
  uint uVar21;
  uint uVar22;
  ulong uVar23;
  uint E6 [8] [64];
  uint local_a50;
  int local_a38 [128];
  int local_838 [64];
  int aiStack_738 [64];
  int aiStack_638 [64];
  int aiStack_538 [64];
  int aiStack_438 [64];
  int aiStack_338 [64];
  int aiStack_238 [64];
  int aiStack_138 [66];
  
  uVar16 = (ulong)(this->m_pTask_pool->m_num_threads + 1);
  uVar7 = (ulong)(this->m_num_blocks >> (this->m_has_subblocks & 0x1fU));
  uVar8 = (uVar7 * data) / uVar16;
  while( true ) {
    local_a50 = (uint)(((data + 1) * uVar7) / uVar16);
    uVar13 = (uint)uVar8;
    if (local_a50 <= uVar13) break;
    for (uVar23 = 1; piVar9 = local_a38, uVar23 < this->m_num_alpha_blocks + 1; uVar23 = uVar23 + 1)
    {
      uVar22 = uVar13 << (this->m_has_subblocks & 0x1fU);
      uVar3 = (this->m_params).m_alpha_component_indices[uVar23 - 1];
      uVar2 = (this->m_endpoint_indices).m_p[uVar22].field_0.component[uVar23];
      paVar4 = (this->m_alpha_clusters).m_p;
      pacVar5 = this->m_blocks;
      for (lVar12 = 0; lVar12 != 0x10; lVar12 = lVar12 + 1) {
        bVar1 = pacVar5[uVar8 & 0xffffffff][lVar12].field_0.c[uVar3];
        for (lVar17 = 0; lVar17 != 8; lVar17 = lVar17 + 1) {
          iVar19 = (uint)bVar1 - paVar4[uVar2].alpha_values[lVar17];
          piVar9[lVar17] = iVar19 * iVar19;
        }
        piVar9 = piVar9 + 8;
      }
      piVar9 = local_838;
      for (lVar12 = 0; lVar12 != 8; lVar12 = lVar12 + 1) {
        for (uVar20 = 0; uVar20 != 0x40; uVar20 = uVar20 + 1) {
          piVar9[uVar20] =
               local_a38[(lVar12 * 2 + 1) * 8 + (uVar20 >> 3 & 0x1fffffff)] +
               local_a38[lVar12 * 0x10 + (ulong)((uint)uVar20 & 7)];
        }
        piVar9 = piVar9 + 0x40;
      }
      uVar20 = 0;
      uVar21 = 0xffffffff;
      for (uVar10 = 0; (this->m_alpha_selectors).m_size != uVar10; uVar10 = uVar10 + 1) {
        uVar6 = (this->m_alpha_selectors).m_p[uVar10];
        uVar14 = (uint)(uVar6 >> 0x20);
        uVar14 = *(int *)((long)aiStack_738 + (ulong)((uint)(uVar6 >> 4) & 0xfc)) +
                 local_838[(uint)uVar6 & 0x3f] +
                 *(int *)((long)aiStack_638 + (ulong)((uint)(uVar6 >> 10) & 0xfc)) +
                 *(int *)((long)aiStack_538 + (ulong)((uint)(uVar6 >> 0x10) & 0xfc)) +
                 *(int *)((long)aiStack_438 + (ulong)((uint)(uVar6 >> 0x16) & 0xfc)) +
                 aiStack_338[(uint)(uVar6 >> 0x1e) & 0x3f] + aiStack_238[uVar14 >> 4 & 0x3f] +
                 aiStack_138[uVar14 >> 10 & 0x3f];
        if (uVar14 < uVar21) {
          uVar20 = uVar10 & 0xffffffff;
          uVar21 = uVar14;
        }
      }
      piVar9 = local_a38;
      if (paVar4[uVar2].refined_alpha != false) {
        piVar11 = piVar9;
        for (lVar12 = 0; lVar12 != 0x10; lVar12 = lVar12 + 1) {
          bVar1 = pacVar5[uVar8 & 0xffffffff][lVar12].field_0.c[uVar3];
          for (lVar17 = 0; lVar17 != 8; lVar17 = lVar17 + 1) {
            iVar19 = (uint)bVar1 - paVar4[uVar2].refined_alpha_values[lVar17];
            piVar11[lVar17] = iVar19 * iVar19;
          }
          piVar11 = piVar11 + 8;
        }
      }
      lVar17 = uVar20 * 0x204 + *pData_ptr;
      lVar12 = lVar17;
      for (lVar15 = 0; lVar15 != 0x10; lVar15 = lVar15 + 1) {
        for (lVar18 = 0; lVar18 != 8; lVar18 = lVar18 + 1) {
          piVar11 = (int *)(lVar12 + lVar18 * 4);
          *piVar11 = *piVar11 + piVar9[lVar18];
        }
        piVar9 = piVar9 + 8;
        lVar12 = lVar12 + 0x20;
      }
      *(undefined1 *)(lVar17 + 0x200) = 1;
      (this->m_selector_indices).m_p[uVar22].field_0.component[uVar23] = (uint16)uVar20;
    }
    uVar8 = (ulong)(uVar13 + 1);
  }
  return;
}

Assistant:

void dxt_hc::create_alpha_selector_codebook_task(uint64 data, void* pData_ptr)
    {
        crnlib::vector<alpha_selector_details>& selector_details = *static_cast<crnlib::vector<alpha_selector_details>*>(pData_ptr);
        uint num_tasks = m_pTask_pool->get_num_threads() + 1;
        uint E3[16][8];
        uint E6[8][64];
        for (uint n = m_has_subblocks ? m_num_blocks >> 1 : m_num_blocks, b = n * data / num_tasks, bEnd = n * (data + 1) / num_tasks; b < bEnd; b++)
        {
            for (uint c = cAlpha0; c < cAlpha0 + m_num_alpha_blocks; c++)
            {
                const uint alpha_pixel_comp = m_params.m_alpha_component_indices[c - cAlpha0];
                alpha_cluster& cluster = m_alpha_clusters[m_endpoint_indices[m_has_subblocks ? b << 1 : b].component[c]];
                uint* block_values = cluster.alpha_values;
                for (uint p = 0; p < 16; p++)
                {
                    for (uint s = 0; s < 8; s++)
                    {
                        int delta = m_blocks[b][p][alpha_pixel_comp] - block_values[s];
                        E3[p][s] = delta * delta;
                    }
                }
                for (uint p = 0; p < 8; p++)
                {
                    for (uint s = 0; s < 64; s++)
                    {
                        E6[p][s] = E3[p << 1][s & 7] + E3[p << 1 | 1][s >> 3];
                    }
                }
                uint best_index = 0;
                for (uint best_error = cUINT32_MAX, s = 0; s < m_alpha_selectors.size(); s++)
                {
                    uint64 selector = m_alpha_selectors[s];
                    uint error = E6[0][selector & 63];
                    error += E6[1][selector >> 6 & 63];
                    error += E6[2][selector >> 12 & 63];
                    error += E6[3][selector >> 18 & 63];
                    error += E6[4][selector >> 24 & 63];
                    error += E6[5][selector >> 30 & 63];
                    error += E6[6][selector >> 36 & 63];
                    error += E6[7][selector >> 42 & 63];
                    if (error < best_error)
                    {
                        best_error = error;
                        best_index = s;
                    }
                }
                if (cluster.refined_alpha)
                {
                    block_values = cluster.refined_alpha_values;
                    for (uint p = 0; p < 16; p++)
                    {
                        for (uint s = 0; s < 8; s++)
                        {
                            int delta = m_blocks[b][p][alpha_pixel_comp] - block_values[s];
                            E3[p][s] = delta * delta;
                        }
                    }
                }
                uint(&total_errors)[16][8] = selector_details[best_index].error;
                for (uint p = 0; p < 16; p++)
                {
                    for (uint s = 0; s < 8; s++)
                    {
                        total_errors[p][s] += E3[p][s];
                    }
                }
                selector_details[best_index].used = true;
                m_selector_indices[m_has_subblocks ? b << 1 : b].component[c] = best_index;
            }
        }
    }